

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpassworddigestor.cpp
# Opt level: O0

QByteArray *
QPasswordDigestor::deriveKeyPbkdf2
          (Algorithm algorithm,QByteArray *data,QByteArray *salt,int iterations,quint64 dkLen)

{
  int iVar1;
  uint uVar2;
  QDebug *o;
  ulong uVar3;
  iterator pcVar4;
  Algorithm in_ESI;
  QByteArray *in_RDI;
  int in_R8D;
  ulong in_R9;
  long in_FS_OFFSET;
  int iter;
  quint32 currentIteration;
  quint64 maxLen;
  int hashLen;
  QByteArray tkey;
  QByteArray u;
  QByteArray index;
  QMessageAuthenticationCode hmac;
  QByteArray key;
  QByteArray *in_stack_fffffffffffffe78;
  QByteArray *in_stack_fffffffffffffe80;
  QByteArray *in_stack_fffffffffffffe88;
  QByteArrayView *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Algorithm value;
  QByteArray *dbg;
  int local_148;
  undefined4 in_stack_fffffffffffffec8;
  QByteArray local_88;
  QByteArrayView *local_70;
  undefined8 local_60;
  QByteArray local_58 [2];
  QDebug local_20;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dbg = in_RDI;
  iVar1 = QCryptographicHash::hashLength(in_ESI);
  value = (Algorithm)((ulong)in_RDI >> 0x20);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if ((ulong)(uVar2 - 1) * (long)iVar1 < in_R9) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
               (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),(char *)in_stack_fffffffffffffe78);
    QMessageLogger::warning();
    QDebug::nospace(&local_20);
    o = QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (char *)CONCAT44(iVar1,in_stack_fffffffffffffec8));
    QDebug::QDebug(&local_18,o);
    ::operator<<((QDebug *)dbg,value);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (char *)CONCAT44(iVar1,in_stack_fffffffffffffec8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffe80,(quint64)in_stack_fffffffffffffe78);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (char *)CONCAT44(iVar1,in_stack_fffffffffffffec8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffe80,(quint64)in_stack_fffffffffffffe78);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (char *)CONCAT44(iVar1,in_stack_fffffffffffffec8));
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug(&local_20);
    QByteArray::QByteArray((QByteArray *)0x267ffb);
  }
  else if ((in_R8D < 1) || (in_R9 == 0)) {
    QByteArray::QByteArray((QByteArray *)0x268019);
  }
  else {
    local_58[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58[0].d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_58[0].d.size = -0x5555555555555556;
    QByteArray::QByteArray((QByteArray *)0x268058);
    local_60 = 0xaaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    QMessageAuthenticationCode::QMessageAuthenticationCode
              ((QMessageAuthenticationCode *)&local_60,in_ESI,local_70);
    local_88.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_88.d.size = -0x5555555555555556;
    QByteArray::QByteArray(&local_88,4,Uninitialized);
    while( true ) {
      uVar3 = QByteArray::size(local_58);
      if (in_R9 <= uVar3) break;
      QByteArrayView::QByteArrayView<QByteArray,_true>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      QMessageAuthenticationCode::addData((QByteArrayView *)&local_60);
      QByteArray::data(in_stack_fffffffffffffe80);
      qToBigEndian<unsigned_int>
                ((uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),in_stack_fffffffffffffe78);
      QByteArrayView::QByteArrayView<QByteArray,_true>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      QMessageAuthenticationCode::addData((QByteArrayView *)&local_60);
      QMessageAuthenticationCode::result();
      QMessageAuthenticationCode::reset();
      QByteArray::QByteArray(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      for (local_148 = 1; local_148 < in_R8D; local_148 = local_148 + 1) {
        QByteArrayView::QByteArrayView<QByteArray,_true>
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        QMessageAuthenticationCode::addData((QByteArrayView *)&local_60);
        QMessageAuthenticationCode::result();
        QByteArray::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        QByteArray::~QByteArray((QByteArray *)0x268295);
        QMessageAuthenticationCode::reset();
        in_stack_fffffffffffffe80 = (QByteArray *)QByteArray::cbegin((QByteArray *)0x2682af);
        in_stack_fffffffffffffe88 = (QByteArray *)QByteArray::cend((QByteArray *)0x2682c1);
        in_stack_fffffffffffffe90 = (QByteArrayView *)QByteArray::cbegin((QByteArray *)0x2682d3);
        pcVar4 = QByteArray::begin((QByteArray *)0x2682e5);
        std::transform<char_const*,char_const*,char*,std::bit_xor<char>>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                   pcVar4);
      }
      QByteArray::operator+=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      QByteArray::~QByteArray((QByteArray *)0x268339);
      QByteArray::~QByteArray((QByteArray *)0x268346);
    }
    QByteArray::left((QByteArray *)in_stack_fffffffffffffe90,(qsizetype)dbg);
    QByteArray::~QByteArray((QByteArray *)0x26836f);
    QMessageAuthenticationCode::~QMessageAuthenticationCode((QMessageAuthenticationCode *)&local_60)
    ;
    QByteArray::~QByteArray((QByteArray *)0x268389);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return dbg;
  }
  __stack_chk_fail();
}

Assistant:

Q_NETWORK_EXPORT QByteArray deriveKeyPbkdf2(QCryptographicHash::Algorithm algorithm,
                                            const QByteArray &data, const QByteArray &salt,
                                            int iterations, quint64 dkLen)
{
    // The RFC recommends checking that 'dkLen' is not greater than '(2^32 - 1) * hLen'
    int hashLen = QCryptographicHash::hashLength(algorithm);
    const quint64 maxLen = quint64(std::numeric_limits<quint32>::max() - 1) * hashLen;
    if (dkLen > maxLen) {
        qWarning().nospace() << "Derived key too long:\n"
                             << algorithm << " was chosen which produces output of length "
                             << maxLen << " but " << dkLen << " was requested.";
        return QByteArray();
    }

    if (iterations < 1 || dkLen < 1)
        return QByteArray();

#ifdef USING_OPENSSL30
    if (methodToName(algorithm))
        return opensslDeriveKeyPbkdf2(algorithm, data, salt, iterations, dkLen);
#endif

    // https://tools.ietf.org/html/rfc8018#section-5.2
    QByteArray key;
    quint32 currentIteration = 1;
    QMessageAuthenticationCode hmac(algorithm, data);
    QByteArray index(4, Qt::Uninitialized);
    while (quint64(key.size()) < dkLen) {
        hmac.addData(salt);

        qToBigEndian(currentIteration, index.data());
        hmac.addData(index);

        QByteArray u = hmac.result();
        hmac.reset();
        QByteArray tkey = u;
        for (int iter = 1; iter < iterations; iter++) {
            hmac.addData(u);
            u = hmac.result();
            hmac.reset();
            std::transform(tkey.cbegin(), tkey.cend(), u.cbegin(), tkey.begin(),
                           std::bit_xor<char>());
        }
        key += tkey;
        currentIteration++;
    }
    return key.left(dkLen);
}